

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SO3QuaternionTest.cpp
# Opt level: O1

void __thiscall SO3Zero::test_method(SO3Zero *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  toQuat xQ;
  Matrix3 res;
  SO3<mnf::ExpMapQuaternion> S;
  Point x;
  CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
  local_2db;
  double local_2d8;
  double local_2d0;
  double local_2c8;
  double local_2c0;
  RealScalar local_2a8;
  undefined1 local_2a0;
  undefined8 local_298;
  shared_count sStack_290;
  char *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  char *local_258;
  char *local_250;
  Matrix<double,_3,_3,_0,_3,_3> local_248;
  undefined **local_200;
  undefined1 local_1f8;
  undefined8 *local_1f0;
  char **local_1e8;
  SO3<mnf::ExpMapQuaternion> local_1e0;
  void *local_138;
  ConstSubPoint local_128 [272];
  
  mnf::SO3<mnf::ExpMapQuaternion>::SO3(&local_1e0);
  mnf::Manifold::getZero();
  mnf::SubPoint::value();
  mnf::utils::ReverseQuaternion::ReverseQuaternion
            ((ReverseQuaternion *)&local_2d8,
             (double *)
             local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[0]);
  local_258 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/SO3QuaternionTest.cpp"
  ;
  local_250 = "";
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_258,0x39);
  dVar1 = local_2d0 + local_2d0;
  dVar3 = local_2c8 + local_2c8;
  dVar2 = local_2d8 * (local_2d8 + local_2d8);
  local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       (local_2d8 + local_2d8) * local_2c0;
  local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       1.0 - (dVar1 * local_2d0 + dVar3 * local_2c8);
  local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       local_2d8 * dVar1 - local_2c0 * dVar3;
  local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
       local_2d8 * dVar3 + dVar1 * local_2c0;
  local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       local_2d8 * dVar1 + local_2c0 * dVar3;
  local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       1.0 - (dVar3 * local_2c8 + dVar2);
  local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
       local_2d0 * dVar3 -
       local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [5];
  local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       local_2d8 * dVar3 - dVar1 * local_2c0;
  local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       local_2d0 * dVar3 +
       local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [5];
  local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
       1.0 - (dVar1 * local_2d0 + dVar2);
  local_2a8 = 1e-12;
  local_2a0 = Eigen::internal::
              isApprox_selector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_false>
              ::run(&local_248,&local_2db,&local_2a8);
  local_298 = 0;
  sStack_290.pi_ = (sp_counted_base *)0x0;
  local_1e8 = &local_278;
  local_278 = "xQ.matrix().isApprox(Eigen::Matrix3d::Identity())";
  local_270 = "";
  local_1f8 = 0;
  local_200 = &PTR__lazy_ostream_00135b88;
  local_1f0 = &boost::unit_test::lazy_ostream::inst;
  local_288 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/SO3QuaternionTest.cpp"
  ;
  local_280 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_290);
  mnf::utils::ReverseQuaternion::~ReverseQuaternion((ReverseQuaternion *)&local_2d8);
  mnf::ConstSubPoint::~ConstSubPoint(local_128);
  free(local_138);
  local_1e0._0_8_ = &PTR__SO3_00135670;
  mnf::ReusableTemporaryMap::~ReusableTemporaryMap
            ((ReusableTemporaryMap *)((long)&local_1e0 + 0x58));
  mnf::Manifold::~Manifold(&local_1e0.super_Manifold);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(SO3Zero)
{
  SO3<ExpMapQuaternion> S;
  Point x = S.getZero();
  toQuat xQ(x.value().data());

  BOOST_CHECK(xQ.matrix().isApprox(Eigen::Matrix3d::Identity()));
}